

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parameter_storage.cpp
# Opt level: O2

bool __thiscall
miniros::master::ParameterStorage::unsubscribeParam
          (ParameterStorage *this,string *caller_id,string *caller_api,string *key)

{
  iterator iVar1;
  allocator<char> local_b9;
  shared_ptr<miniros::master::NodeRef> nodeRef;
  string fullKey;
  Path path;
  
  if (console::g_initialized == '\0') {
    console::initialize();
  }
  if (unsubscribeParam::loc.initialized_ == false) {
    ::std::__cxx11::string::string<std::allocator<char>>
              ((string *)&nodeRef,"miniros.unknown_package",&local_b9);
    ::std::operator+(&fullKey,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &nodeRef,".");
    ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&path,
                     &fullKey,"rosparam");
    console::initializeLogLocation(&unsubscribeParam::loc,(string *)&path,Info);
    ::std::__cxx11::string::~string((string *)&path);
    ::std::__cxx11::string::~string((string *)&fullKey);
    ::std::__cxx11::string::~string((string *)&nodeRef);
  }
  if (unsubscribeParam::loc.level_ != Info) {
    console::setLogLocationLevel(&unsubscribeParam::loc,Info);
    console::checkLogLocationEnabled(&unsubscribeParam::loc);
  }
  if (unsubscribeParam::loc.logger_enabled_ == true) {
    console::print((FilterBase *)0x0,unsubscribeParam::loc.logger_,unsubscribeParam::loc.level_,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/dkargin[P]miniroscpp/src/roscore/parameter_storage.cpp"
                   ,0x12e,
                   "bool miniros::master::ParameterStorage::unsubscribeParam(const std::string &, const std::string &, const std::string &)"
                   ,"unsubscribeParam(\"%s\") from %s, api=%s",(key->_M_dataplus)._M_p,
                   (caller_id->_M_dataplus)._M_p,(caller_api->_M_dataplus)._M_p);
  }
  names::resolve(&fullKey,caller_id,key,false);
  names::Path::Path(&path);
  names::Path::fromString(&path,&fullKey);
  ::std::mutex::lock(&this->m_parameterLock);
  if (this->m_regManager != (RegistrationManager *)0x0) {
    iVar1 = ::std::
            _Rb_tree<miniros::names::Path,_std::pair<const_miniros::names::Path,_std::set<std::shared_ptr<miniros::master::NodeRef>,_std::less<std::shared_ptr<miniros::master::NodeRef>_>,_std::allocator<std::shared_ptr<miniros::master::NodeRef>_>_>_>,_std::_Select1st<std::pair<const_miniros::names::Path,_std::set<std::shared_ptr<miniros::master::NodeRef>,_std::less<std::shared_ptr<miniros::master::NodeRef>_>,_std::allocator<std::shared_ptr<miniros::master::NodeRef>_>_>_>_>,_std::less<miniros::names::Path>,_std::allocator<std::pair<const_miniros::names::Path,_std::set<std::shared_ptr<miniros::master::NodeRef>,_std::less<std::shared_ptr<miniros::master::NodeRef>_>,_std::allocator<std::shared_ptr<miniros::master::NodeRef>_>_>_>_>_>
            ::find(&(this->m_parameterListeners)._M_t,&path);
    if ((_Rb_tree_header *)iVar1._M_node !=
        &(this->m_parameterListeners)._M_t._M_impl.super__Rb_tree_header) {
      RegistrationManager::getNodeByName
                ((RegistrationManager *)&nodeRef,(string *)this->m_regManager);
      ::std::
      _Rb_tree<std::shared_ptr<miniros::master::NodeRef>,_std::shared_ptr<miniros::master::NodeRef>,_std::_Identity<std::shared_ptr<miniros::master::NodeRef>_>,_std::less<std::shared_ptr<miniros::master::NodeRef>_>,_std::allocator<std::shared_ptr<miniros::master::NodeRef>_>_>
      ::erase((_Rb_tree<std::shared_ptr<miniros::master::NodeRef>,_std::shared_ptr<miniros::master::NodeRef>,_std::_Identity<std::shared_ptr<miniros::master::NodeRef>_>,_std::less<std::shared_ptr<miniros::master::NodeRef>_>,_std::allocator<std::shared_ptr<miniros::master::NodeRef>_>_>
               *)&iVar1._M_node[3]._M_left,&nodeRef);
      ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&nodeRef.super___shared_ptr<miniros::master::NodeRef,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
    }
  }
  pthread_mutex_unlock((pthread_mutex_t *)&this->m_parameterLock);
  names::Path::~Path(&path);
  ::std::__cxx11::string::~string((string *)&fullKey);
  return true;
}

Assistant:

bool ParameterStorage::unsubscribeParam(
  const std::string& caller_id, const std::string& caller_api, const std::string& key)
{
  MINIROS_INFO_NAMED("rosparam", "unsubscribeParam(\"%s\") from %s, api=%s", key.c_str(), caller_id.c_str(), caller_api.c_str());

  std::string fullKey = miniros::names::resolve(caller_id, key, false);

  names::Path path;
  path.fromString(fullKey);

  std::scoped_lock<std::mutex> lock(m_parameterLock);
  if (m_regManager) {
    auto it = m_parameterListeners.find(path);
    if (it != m_parameterListeners.end()) {
      std::shared_ptr<NodeRef> nodeRef = m_regManager->getNodeByName(caller_id);
      it->second.erase(nodeRef);
    }
  }
  return true;
}